

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

string * __thiscall
LinearSystem::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  Matrix *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  Operation *operation;
  pointer pOVar7;
  int iVar8;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  int local_328;
  int local_324;
  SwapMatrix local_318;
  string *local_2f8;
  ExtendedMatrix *local_2f0;
  pointer local_2e8;
  long local_2e0 [14];
  ios_base local_270 [264];
  LinearSystem local_168;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
  LinearSystem(&local_168,&this->start_system_,this->mode_);
  local_2f8 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\[",2);
  std::ios::widen((char)(ostream *)local_2e0 + (char)*(undefined8 *)(local_2e0[0] + -0x18));
  std::ostream::put((char)local_2e0);
  std::ostream::flush();
  poVar3 = operator<<((ostream *)local_2e0,&local_168.system_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_318.first_row_ = 0;
  local_318.second_row_ = 0;
  local_318.first_main_column_ = 0;
  local_318.second_main_column_ = 0;
  local_318.first_extension_column_ = 0;
  local_318.second_extension_column_ = 0;
  pOVar7 = (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2e8 = (this->history_).
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar7 != local_2e8) {
    local_2f0 = &this->system_;
    iVar4 = 1;
    iVar2 = 0;
    local_324 = 0;
    local_328 = 0;
    iVar8 = 0;
    iVar6 = 0;
    iVar5 = 0;
    do {
      ApplyOperation(&local_168,pOVar7->operation_type,pOVar7->lhs,pOVar7->rhs,pOVar7->coefficient);
      if (pOVar7->operation_type == SwapColumns) {
        iVar8 = pOVar7->lhs + 1;
        local_328 = pOVar7->rhs + 1;
        local_318.second_main_column_ = local_328;
        local_318.first_main_column_ = iVar8;
      }
      else if (pOVar7->operation_type == SwapRows) {
        iVar5 = pOVar7->lhs + 1;
        iVar6 = pOVar7->rhs + 1;
        local_318.second_row_ = iVar6;
        local_318.first_row_ = iVar5;
        if (this->mode_ == LU) {
          this_00 = ExtendedMatrix::GetMainMatrix(local_2f0);
          iVar2 = Matrix::GetNumColumns(this_00);
          local_324 = pOVar7->lhs + iVar2 + 1;
          iVar2 = iVar2 + 1 + pOVar7->rhs;
          local_318.second_extension_column_ = iVar2;
          local_318.first_extension_column_ = local_324;
        }
      }
      if ((Options::step_by_step_type == 2) ||
         ((Options::step_by_step_type == 1 && (pOVar7->operation_type == MainOutput)))) {
        if (iVar4 == Options::max_matrices_count_in_row) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + (char)local_2e0);
          std::ostream::put((char)local_2e0);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\]",2);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + (char)local_2e0);
          std::ostream::put((char)local_2e0);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\[",2);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + (char)local_2e0);
          std::ostream::put((char)local_2e0);
          iVar4 = 0;
          std::ostream::flush();
        }
        if (((iVar5 != iVar6) || (iVar8 != local_328)) || (iVar5 = iVar6, local_324 != iVar2)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
          operator<<((ostream *)local_2e0,&local_318);
          local_318.first_row_ = 0;
          local_318.second_row_ = 0;
          local_318.first_main_column_ = 0;
          local_318.second_main_column_ = 0;
          local_318.first_extension_column_ = 0;
          local_318.second_extension_column_ = 0;
          iVar2 = 0;
          local_328 = 0;
          iVar5 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
        poVar3 = operator<<((ostream *)local_2e0,&local_168.system_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        iVar4 = iVar4 + 1;
        iVar6 = iVar5;
        iVar8 = local_328;
        local_324 = iVar2;
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != local_2e8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\]",2);
  psVar1 = local_2f8;
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&local_168);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
  std::ios_base::~ios_base(local_270);
  return psVar1;
}

Assistant:

std::string LinearSystem::ToLaTex() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);

  out << "\\[" << std::endl;
  out << current_system.system_ << std::endl;

  SwapMatrix swaps;
  int matrices_count_in_row = 1;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
         operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    if (matrices_count_in_row == Options::max_matrices_count_in_row) {
      out << "\\sim" << std::endl;
      out << "\\]" << std::endl;
      out << "\\[" << std::endl;
      matrices_count_in_row = 0;
    }

    if (!swaps.IsEmpty()) {
      out << "\\sim" << swaps;
      swaps.Clear();
    }

    out << "\\sim" << current_system.system_ << std::endl;
    ++matrices_count_in_row;
  }

  out << "\\]";

  return out.str();
}